

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool ClipperLib::SlopesEqual(IntPoint pt1,IntPoint pt2,IntPoint pt3,bool UseFullInt64Range)

{
  long lVar1;
  bool bVar2;
  Int128 local_78;
  Int128 local_68;
  long local_58;
  long local_50;
  Int128 local_48;
  Int128 local_38;
  
  lVar1 = pt2.X;
  local_48.lo = pt1.Y - pt2.Y;
  if (UseFullInt64Range) {
    local_48.hi = local_48.lo >> 0x3f;
    local_50 = lVar1 - pt3.X;
    local_58 = local_50 >> 0x3f;
    Int128::operator*(&local_38,&local_48);
    local_78.lo = pt1.X - lVar1;
    local_78.hi = local_78.lo >> 0x3f;
    Int128::operator*(&local_68,&local_78);
    bVar2 = local_68.lo == local_38.lo && local_38.hi == local_68.hi;
  }
  else {
    bVar2 = (lVar1 - pt3.X) * local_48.lo - (pt2.Y - pt3.Y) * (pt1.X - lVar1) == 0;
  }
  return bVar2;
}

Assistant:

bool SlopesEqual(const IntPoint pt1, const IntPoint pt2,
  const IntPoint pt3, bool UseFullInt64Range)
{
  if (UseFullInt64Range)
    return Int128(pt1.Y-pt2.Y) * Int128(pt2.X-pt3.X) ==
      Int128(pt1.X-pt2.X) * Int128(pt2.Y-pt3.Y);
  else return (pt1.Y-pt2.Y)*(pt2.X-pt3.X) == (pt1.X-pt2.X)*(pt2.Y-pt3.Y);
}